

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *p,Gia_PtrAre_t Sta)

{
  Vec_Vec_t *pVVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pObj_00;
  abctime aVar6;
  Gia_StaAre_t *pSta;
  abctime aVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  bool bVar8;
  bool local_51;
  Gia_StaAre_t *pNew;
  abctime clk;
  Gia_Obj_t *pGStack_38;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vTfos;
  Vec_Int_t *vLits;
  Gia_Obj_t *pPivot;
  Gia_ManAre_t *p_local;
  Gia_PtrAre_t Sta_local;
  
  iVar3 = p->nRecCalls + 1;
  p->nRecCalls = iVar3;
  if (iVar3 == 1000000) {
    p_local._4_4_ = 0;
  }
  else {
    pObj_00 = Gia_ManAreMostUsedPi(p);
    if (pObj_00 == (Gia_Obj_t *)0x0) {
      aVar6 = Abc_Clock();
      pSta = Gia_ManAreCreateStaNew(p);
      pSta->iPrev = Sta;
      local_51 = false;
      if (p->fMiter != 0) {
        uVar4 = Gia_ManCheckPOstatus(p);
        local_51 = (uVar4 & 1) != 0;
      }
      p->fStopped = (uint)local_51;
      if (p->fStopped == 0) {
        Gia_ManAreCubeProcess(p,pSta);
        aVar7 = Abc_Clock();
        p->timeCube = p->timeCube + ((int)aVar7 - (int)aVar6);
        p_local._4_4_ = p->fStopped;
      }
      else {
        if (p->pTarget != (Gia_StaAre_t *)0x0) {
          __assert_fail("p->pTarget == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                        ,0x617,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
        }
        p->pTarget = pSta;
        p_local._4_4_ = 1;
      }
    }
    else {
      pVVar1 = p->vCiTfos;
      iVar3 = Gia_ObjCioId(pObj_00);
      p_00 = Vec_VecEntryInt(pVVar1,iVar3);
      pVVar1 = p->vCiLits;
      iVar3 = Gia_ObjCioId(pObj_00);
      p_01 = Vec_VecEntryInt(pVVar1,iVar3);
      iVar3 = Vec_IntSize(p_00);
      iVar5 = Vec_IntSize(p_01);
      if (iVar3 != iVar5) {
        __assert_fail("Vec_IntSize(vTfos) == Vec_IntSize(vLits)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                      ,0x622,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
      }
      clk._4_4_ = 0;
      while( true ) {
        iVar3 = Vec_IntSize(p_00);
        bVar8 = false;
        if (clk._4_4_ < iVar3) {
          pGVar2 = p->pAig;
          iVar3 = Vec_IntEntry(p_00,clk._4_4_);
          pGStack_38 = Gia_ManObj(pGVar2,iVar3);
          bVar8 = pGStack_38 != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        Vec_IntWriteEntry(p_01,clk._4_4_,pGStack_38->Value);
        iVar3 = Gia_ObjIsAnd(pGStack_38);
        if (iVar3 == 0) {
          iVar3 = Gia_ObjIsCo(pGStack_38);
          if (iVar3 == 0) {
            iVar3 = Gia_ObjIsCi(pGStack_38);
            if (iVar3 == 0) {
              __assert_fail("Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x62c,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
            }
            pGStack_38->Value = 0;
          }
          else {
            uVar4 = Gia_ObjFanin0Copy(pGStack_38);
            pGStack_38->Value = uVar4;
          }
        }
        else {
          pGVar2 = p->pNew;
          iVar3 = Gia_ObjFanin0Copy(pGStack_38);
          iVar5 = Gia_ObjFanin1Copy(pGStack_38);
          uVar4 = Gia_ManHashAnd(pGVar2,iVar3,iVar5);
          pGStack_38->Value = uVar4;
        }
        clk._4_4_ = clk._4_4_ + 1;
      }
      iVar3 = Gia_ManAreDeriveNexts_rec(p,Sta);
      if (iVar3 == 0) {
        clk._4_4_ = 0;
        while( true ) {
          iVar3 = Vec_IntSize(p_00);
          bVar8 = false;
          if (clk._4_4_ < iVar3) {
            pGVar2 = p->pAig;
            iVar3 = Vec_IntEntry(p_00,clk._4_4_);
            pGStack_38 = Gia_ManObj(pGVar2,iVar3);
            bVar8 = pGStack_38 != (Gia_Obj_t *)0x0;
          }
          if (!bVar8) break;
          iVar3 = Gia_ObjIsAnd(pGStack_38);
          if (iVar3 == 0) {
            iVar3 = Gia_ObjIsCo(pGStack_38);
            if (iVar3 == 0) {
              iVar3 = Gia_ObjIsCi(pGStack_38);
              if (iVar3 == 0) {
                __assert_fail("Gia_ObjIsCi(pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                              ,0x63b,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
              }
              pGStack_38->Value = 1;
            }
            else {
              uVar4 = Gia_ObjFanin0Copy(pGStack_38);
              pGStack_38->Value = uVar4;
            }
          }
          else {
            pGVar2 = p->pNew;
            iVar3 = Gia_ObjFanin0Copy(pGStack_38);
            iVar5 = Gia_ObjFanin1Copy(pGStack_38);
            uVar4 = Gia_ManHashAnd(pGVar2,iVar3,iVar5);
            pGStack_38->Value = uVar4;
          }
          clk._4_4_ = clk._4_4_ + 1;
        }
        iVar3 = Gia_ManAreDeriveNexts_rec(p,Sta);
        if (iVar3 == 0) {
          clk._4_4_ = 0;
          while( true ) {
            iVar3 = Vec_IntSize(p_00);
            bVar8 = false;
            if (clk._4_4_ < iVar3) {
              pGVar2 = p->pAig;
              iVar3 = Vec_IntEntry(p_00,clk._4_4_);
              pGStack_38 = Gia_ManObj(pGVar2,iVar3);
              bVar8 = pGStack_38 != (Gia_Obj_t *)0x0;
            }
            if (!bVar8) break;
            uVar4 = Vec_IntEntry(p_01,clk._4_4_);
            pGStack_38->Value = uVar4;
            clk._4_4_ = clk._4_4_ + 1;
          }
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = 1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManAreDeriveNexts_rec( Gia_ManAre_t * p, Gia_PtrAre_t Sta )
{
    Gia_Obj_t * pPivot;
    Vec_Int_t * vLits, * vTfos;
    Gia_Obj_t * pObj;
    int i;
    abctime clk;
    if ( ++p->nRecCalls == MAX_CALL_NUM )
        return 0;
    if ( (pPivot = Gia_ManAreMostUsedPi(p)) == NULL )
    {
        Gia_StaAre_t * pNew;
        clk = Abc_Clock();
        pNew = Gia_ManAreCreateStaNew( p );
        pNew->iPrev = Sta;
        p->fStopped = (p->fMiter && (Gia_ManCheckPOstatus(p) & 1));
        if ( p->fStopped )
        {
            assert( p->pTarget == NULL );
            p->pTarget = pNew;
            return 1;
        }
        Gia_ManAreCubeProcess( p, pNew );
        p->timeCube += Abc_Clock() - clk;
        return p->fStopped;
    }
    // remember values in the cone and perform update
    vTfos = Vec_VecEntryInt( p->vCiTfos, Gia_ObjCioId(pPivot) );
    vLits = Vec_VecEntryInt( p->vCiLits, Gia_ObjCioId(pPivot) );
    assert( Vec_IntSize(vTfos) == Vec_IntSize(vLits) );
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
    {
        Vec_IntWriteEntry( vLits, i, pObj->Value );
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        else 
        {
            assert( Gia_ObjIsCi(pObj) );
            pObj->Value = 0;
        }
    }
    if ( Gia_ManAreDeriveNexts_rec( p, Sta ) )
        return 1;
    // compute different values
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        else 
        {
            assert( Gia_ObjIsCi(pObj) );
            pObj->Value = 1;
        }
    }
    if ( Gia_ManAreDeriveNexts_rec( p, Sta ) )
        return 1;
    // reset the original values
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
        pObj->Value = Vec_IntEntry( vLits, i );
    return 0;
}